

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O1

CURLcode Curl_retry_request(Curl_easy *data,char **url)

{
  undefined1 *puVar1;
  int iVar2;
  connectdata *conn;
  long lVar3;
  long lVar4;
  uint uVar5;
  CURLcode CVar6;
  char *pcVar7;
  CURLcode CVar8;
  
  conn = data->conn;
  *url = (char *)0x0;
  uVar5 = (uint)*(undefined8 *)&(data->set).field_0x8e2;
  if (((uVar5 >> 0x1a & 1) == 0) || ((conn->handler->protocol & 0x40003) != 0)) {
    lVar3 = (data->req).bytecount;
    lVar4 = -(data->req).headerbytecount;
    if (((lVar3 != lVar4) || (((conn->bits).field_0x4 & 0x80) == 0)) ||
       (((uVar5 >> 0x19 & 1) != 0 && ((conn->handler->protocol & 3) == 0)))) {
      if (lVar3 != lVar4) {
        return CURLE_OK;
      }
      if ((*(uint *)&(data->state).field_0x6d0 & 4) == 0) {
        return CURLE_OK;
      }
      Curl_infof(data,"REFUSED_STREAM, retrying a fresh connect");
      puVar1 = &(data->state).field_0x6d0;
      *puVar1 = *puVar1 & 0xfb;
    }
    iVar2 = (data->state).retrycount;
    (data->state).retrycount = iVar2 + 1;
    if (iVar2 < 5) {
      CVar8 = CURLE_OK;
      Curl_infof(data,"Connection died, retrying a fresh connect (retry count: %d)");
      pcVar7 = (*Curl_cstrdup)((data->state).url);
      *url = pcVar7;
      if (pcVar7 == (char *)0x0) {
        CVar8 = CURLE_OUT_OF_MEMORY;
      }
      else {
        Curl_conncontrol(conn,1);
        puVar1 = &(conn->bits).field_0x5;
        *puVar1 = *puVar1 | 0x80;
        if ((((conn->handler->protocol & 3) != 0) && ((data->req).writebytecount != 0)) &&
           (CVar6 = Curl_readrewind(data), CVar6 != CURLE_OK)) {
          (*Curl_cfree)(*url);
          *url = (char *)0x0;
          CVar8 = CVar6;
        }
      }
    }
    else {
      Curl_failf(data,"Connection died, tried %d times before giving up",5);
      (data->state).retrycount = 0;
      CVar8 = CURLE_SEND_ERROR;
    }
  }
  else {
    CVar8 = CURLE_OK;
  }
  return CVar8;
}

Assistant:

CURLcode Curl_retry_request(struct Curl_easy *data, char **url)
{
  struct connectdata *conn = data->conn;
  bool retry = FALSE;
  *url = NULL;

  /* if we're talking upload, we can't do the checks below, unless the protocol
     is HTTP as when uploading over HTTP we will still get a response */
  if(data->set.upload &&
     !(conn->handler->protocol&(PROTO_FAMILY_HTTP|CURLPROTO_RTSP)))
    return CURLE_OK;

  if((data->req.bytecount + data->req.headerbytecount == 0) &&
     conn->bits.reuse &&
     (!data->set.opt_no_body || (conn->handler->protocol & PROTO_FAMILY_HTTP))
#ifndef CURL_DISABLE_RTSP
     && (data->set.rtspreq != RTSPREQ_RECEIVE)
#endif
    )
    /* We got no data, we attempted to re-use a connection. For HTTP this
       can be a retry so we try again regardless if we expected a body.
       For other protocols we only try again only if we expected a body.

       This might happen if the connection was left alive when we were
       done using it before, but that was closed when we wanted to read from
       it again. Bad luck. Retry the same request on a fresh connect! */
    retry = TRUE;
  else if(data->state.refused_stream &&
          (data->req.bytecount + data->req.headerbytecount == 0) ) {
    /* This was sent on a refused stream, safe to rerun. A refused stream
       error can typically only happen on HTTP/2 level if the stream is safe
       to issue again, but the nghttp2 API can deliver the message to other
       streams as well, which is why this adds the check the data counters
       too. */
    infof(data, "REFUSED_STREAM, retrying a fresh connect");
    data->state.refused_stream = FALSE; /* clear again */
    retry = TRUE;
  }
  if(retry) {
#define CONN_MAX_RETRIES 5
    if(data->state.retrycount++ >= CONN_MAX_RETRIES) {
      failf(data, "Connection died, tried %d times before giving up",
            CONN_MAX_RETRIES);
      data->state.retrycount = 0;
      return CURLE_SEND_ERROR;
    }
    infof(data, "Connection died, retrying a fresh connect (retry count: %d)",
          data->state.retrycount);
    *url = strdup(data->state.url);
    if(!*url)
      return CURLE_OUT_OF_MEMORY;

    connclose(conn, "retry"); /* close this connection */
    conn->bits.retry = TRUE; /* mark this as a connection we're about
                                to retry. Marking it this way should
                                prevent i.e HTTP transfers to return
                                error just because nothing has been
                                transferred! */


    if(conn->handler->protocol&PROTO_FAMILY_HTTP) {
      if(data->req.writebytecount) {
        CURLcode result = Curl_readrewind(data);
        if(result) {
          Curl_safefree(*url);
          return result;
        }
      }
    }
  }
  return CURLE_OK;
}